

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adapter.cpp
# Opt level: O0

int8_t msocket_adapter_tcp_data(void *arg,uint8_t *dataBuf,uint32_t dataLen,uint32_t *parseLen)

{
  undefined8 uStack_48;
  int result;
  size_t parse_len;
  size_t data_size;
  Handler *handler;
  uint32_t *parseLen_local;
  uint8_t *puStack_20;
  uint32_t dataLen_local;
  uint8_t *dataBuf_local;
  void *arg_local;
  
  if (arg == (void *)0x0) {
    arg_local._7_1_ = -1;
  }
  else {
    parse_len = (size_t)dataLen;
    uStack_48 = 0;
    data_size = (size_t)arg;
    handler = (Handler *)parseLen;
    parseLen_local._4_4_ = dataLen;
    puStack_20 = dataBuf;
    dataBuf_local = (uint8_t *)arg;
    arg_local._7_1_ = (**(code **)(*arg + 0x20))(arg,dataBuf,parse_len,&stack0xffffffffffffffb8);
    if (handler != (Handler *)0x0) {
      *(int *)&handler->_vptr_Handler = (int)uStack_48;
    }
  }
  return arg_local._7_1_;
}

Assistant:

static int8_t msocket_adapter_tcp_data(void* arg, const uint8_t* dataBuf, uint32_t dataLen, uint32_t* parseLen)
{
   auto handler = reinterpret_cast<msocket::Handler*>(arg);
   if (handler != nullptr)
   {
      std::size_t data_size = static_cast<std::size_t>(dataLen);
      std::size_t parse_len = 0u;
      int result = handler->socket_data_received(dataBuf, data_size, parse_len);
      if (parseLen != nullptr)
      {
         *parseLen = static_cast<std::uint32_t>(parse_len);
      }
      return static_cast<std::int8_t>(result);
   }
   return -1;
}